

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O1

bool embree::sse2::InstanceArrayIntersector1MB::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  Vec3ff *pVVar1;
  float *pfVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  Geometry *pGVar7;
  RTCRayQueryContext *pRVar8;
  long *plVar9;
  long lVar10;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  _func_int *p_Var17;
  float extraout_XMM0_Dc;
  undefined1 auVar18 [12];
  float extraout_XMM0_Db;
  undefined1 in_XMM0 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float in_XMM1_Da;
  float in_XMM1_Db;
  float in_XMM1_Dc;
  vfloat4 a0;
  float in_XMM2_Da;
  float in_XMM2_Db;
  float fVar23;
  float in_XMM2_Dc;
  float fVar24;
  float in_XMM2_Dd;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar25 [12];
  vfloat4 l02;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float in_XMM4_Da;
  float in_XMM4_Db;
  float in_XMM4_Dc;
  float in_XMM4_Dd;
  float in_XMM5_Da;
  float fVar28;
  float in_XMM5_Db;
  float in_XMM5_Dc;
  float in_XMM6_Da;
  float fVar29;
  float in_XMM6_Db;
  float in_XMM6_Dc;
  float in_XMM6_Dd;
  float fVar30;
  undefined1 auVar31 [12];
  uint uVar32;
  undefined1 in_XMM7 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float in_XMM10_Da;
  float in_XMM10_Db;
  float in_XMM10_Dc;
  float in_XMM10_Dd;
  float in_XMM11_Da;
  float fVar40;
  float fVar41;
  float fVar42;
  float in_XMM11_Db;
  float in_XMM11_Dc;
  float in_XMM11_Dd;
  float in_XMM12_Da;
  float fVar43;
  float in_XMM12_Db;
  float in_XMM12_Dc;
  float in_XMM12_Dd;
  float in_XMM13_Da;
  float fVar44;
  float fVar45;
  float in_XMM13_Db;
  float in_XMM13_Dc;
  float in_XMM13_Dd;
  float in_XMM14_Da;
  float fVar46;
  float fVar47;
  float fVar48;
  float in_XMM14_Db;
  float in_XMM14_Dc;
  undefined1 auVar49 [16];
  float fVar50;
  float fVar51;
  float fVar52;
  RayQueryContext newcontext;
  undefined1 local_178 [8];
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  float local_148;
  undefined4 uStack_144;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  
  auVar18 = in_XMM0._0_12_;
  auVar31 = in_XMM7._0_12_;
  uVar13 = prim->primID_;
  pGVar7 = (context->scene->geometries).items[prim->instID_].ptr;
  p_Var17 = *(_func_int **)&pGVar7->field_0x58;
  if (p_Var17 == (_func_int *)0x0) {
    uVar14 = (ulong)*(uint *)(*(long *)&pGVar7[1].time_range.upper +
                             (long)pGVar7[1].intersectionFilterN * (ulong)uVar13);
    if (uVar14 == 0xffffffff) {
      p_Var17 = (_func_int *)0x0;
    }
    else {
      p_Var17 = pGVar7[1].super_RefCount._vptr_RefCount[uVar14];
    }
  }
  if (((p_Var17 == (_func_int *)0x0) || ((ray->mask & pGVar7->mask) == 0)) ||
     (pRVar8 = context->user, pRVar8->instID[0] != 0xffffffff)) {
    return false;
  }
  pRVar8->instID[0] = prim->instID_;
  pRVar8->instPrimID[0] = uVar13;
  uVar14 = (ulong)prim->primID_;
  if (pGVar7->numTimeSteps == 1) {
    plVar9 = *(long **)&pGVar7[1].fnumTimeSegments;
    iVar6 = (int)plVar9[4];
    if ((pGVar7->field_8).field_0x1 != '\x01') {
      if (iVar6 == 0x9134) {
        lVar10 = *plVar9;
        lVar16 = uVar14 * plVar9[2];
        in_XMM14_Db = *(float *)(lVar10 + 0x10 + lVar16);
        in_XMM14_Da = *(float *)(lVar10 + lVar16);
        in_XMM1_Da = *(float *)(lVar10 + 4 + lVar16);
        in_XMM5_Da = *(float *)(lVar10 + 0xc + lVar16);
        in_XMM14_Dc = *(float *)(lVar10 + 0x20 + lVar16);
        in_XMM1_Db = *(float *)(lVar10 + 0x14 + lVar16);
        in_XMM1_Dc = *(float *)(lVar10 + 0x24 + lVar16);
        auVar18._4_4_ = (float)*(undefined4 *)(lVar10 + 0x18 + lVar16);
        auVar18._0_4_ = (float)*(undefined4 *)(lVar10 + 8 + lVar16);
        auVar18._8_4_ = (float)*(undefined4 *)(lVar10 + 0x28 + lVar16);
        in_XMM5_Db = *(float *)(lVar10 + 0x1c + lVar16);
        in_XMM5_Dc = *(float *)(lVar10 + 0x2c + lVar16);
      }
      else if (iVar6 == 0x9234) {
        lVar10 = *plVar9;
        lVar16 = uVar14 * plVar9[2];
        uVar4 = *(undefined8 *)(lVar10 + 4 + lVar16);
        in_XMM14_Da = *(float *)(lVar10 + lVar16);
        in_XMM14_Db = (float)uVar4;
        in_XMM14_Dc = (float)((ulong)uVar4 >> 0x20);
        uVar4 = *(undefined8 *)(lVar10 + 0x10 + lVar16);
        in_XMM1_Da = *(float *)(lVar10 + 0xc + lVar16);
        in_XMM1_Db = (float)uVar4;
        in_XMM1_Dc = (float)((ulong)uVar4 >> 0x20);
        uVar4 = *(undefined8 *)(lVar10 + 0x1c + lVar16);
        auVar18._4_4_ = (float)(int)uVar4;
        auVar18._0_4_ = (float)*(undefined4 *)(lVar10 + 0x18 + lVar16);
        auVar18._8_4_ = (float)(int)((ulong)uVar4 >> 0x20);
        uVar4 = *(undefined8 *)(lVar10 + 0x28 + lVar16);
        in_XMM5_Da = *(float *)(lVar10 + 0x24 + lVar16);
        in_XMM5_Db = (float)uVar4;
        in_XMM5_Dc = (float)((ulong)uVar4 >> 0x20);
      }
      else if (iVar6 == 0xb001) {
        lVar10 = *plVar9;
        lVar16 = uVar14 * plVar9[2];
        uVar4 = *(undefined8 *)(lVar10 + 0x34 + lVar16);
        in_XMM14_Da = *(float *)(lVar10 + lVar16);
        in_XMM1_Db = *(float *)(lVar10 + 4 + lVar16);
        in_XMM1_Da = *(float *)(lVar10 + 0xc + lVar16);
        in_XMM5_Da = *(float *)(lVar10 + 0x18 + lVar16);
        uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar16);
        in_XMM5_Db = (float)uVar5;
        in_XMM5_Dc = (float)((ulong)uVar5 >> 0x20);
        fVar40 = *(float *)(lVar10 + 0x24 + lVar16);
        fVar46 = *(float *)(lVar10 + 0x28 + lVar16);
        fVar30 = *(float *)(lVar10 + 0x2c + lVar16);
        fVar23 = *(float *)(lVar10 + 0x30 + lVar16);
        fVar40 = fVar23 * fVar23 + fVar30 * fVar30 + fVar40 * fVar40 + fVar46 * fVar46;
        rsqrtss(ZEXT416((uint)fVar40),ZEXT416((uint)fVar40));
        auVar18._8_4_ = (float)*(undefined4 *)(lVar10 + 8 + lVar16);
        auVar18._0_8_ = *(undefined8 *)(lVar10 + 0x10 + lVar16);
        in_XMM14_Db = (float)uVar4;
        in_XMM14_Dc = (float)((ulong)uVar4 >> 0x20);
        in_XMM1_Dc = *(float *)(lVar10 + 0x3c + lVar16);
      }
      else if (iVar6 == 0x9244) {
        lVar10 = *plVar9;
        lVar16 = uVar14 * plVar9[2];
        pfVar2 = (float *)(lVar10 + lVar16);
        in_XMM14_Da = *pfVar2;
        in_XMM14_Db = pfVar2[1];
        in_XMM14_Dc = pfVar2[2];
        pfVar2 = (float *)(lVar10 + 0x10 + lVar16);
        in_XMM1_Da = *pfVar2;
        in_XMM1_Db = pfVar2[1];
        in_XMM1_Dc = pfVar2[2];
        auVar18 = SUB1612(*(undefined1 (*) [16])(lVar10 + 0x20 + lVar16),0);
        pfVar2 = (float *)(lVar10 + 0x30 + lVar16);
        in_XMM5_Da = *pfVar2;
        in_XMM5_Db = pfVar2[1];
        in_XMM5_Dc = pfVar2[2];
      }
      goto LAB_00181b7d;
    }
    if (iVar6 == 0x9134) {
      lVar10 = *plVar9;
      lVar16 = uVar14 * plVar9[2];
      in_XMM13_Db = *(float *)(lVar10 + 0x10 + lVar16);
      in_XMM13_Da = *(float *)(lVar10 + lVar16);
      in_XMM2_Da = *(float *)(lVar10 + 4 + lVar16);
      in_XMM6_Da = *(float *)(lVar10 + 8 + lVar16);
      in_XMM4_Da = *(float *)(lVar10 + 0xc + lVar16);
      in_XMM13_Dc = *(float *)(lVar10 + 0x20 + lVar16);
      in_XMM13_Dd = 0.0;
      in_XMM2_Db = *(float *)(lVar10 + 0x14 + lVar16);
      in_XMM2_Dc = *(float *)(lVar10 + 0x24 + lVar16);
      in_XMM2_Dd = 0.0;
      in_XMM6_Db = *(float *)(lVar10 + 0x18 + lVar16);
      in_XMM6_Dc = *(float *)(lVar10 + 0x28 + lVar16);
      in_XMM6_Dd = 0.0;
      in_XMM4_Db = *(float *)(lVar10 + 0x1c + lVar16);
      in_XMM4_Dc = *(float *)(lVar10 + 0x2c + lVar16);
      in_XMM4_Dd = 0.0;
    }
    else if (iVar6 == 0x9234) {
      lVar10 = *plVar9;
      lVar16 = uVar14 * plVar9[2];
      uVar4 = *(undefined8 *)(lVar10 + 4 + lVar16);
      in_XMM13_Da = *(float *)(lVar10 + lVar16);
      in_XMM13_Db = (float)uVar4;
      in_XMM13_Dc = (float)((ulong)uVar4 >> 0x20);
      in_XMM13_Dd = 0.0;
      uVar4 = *(undefined8 *)(lVar10 + 0x10 + lVar16);
      in_XMM2_Da = *(float *)(lVar10 + 0xc + lVar16);
      in_XMM2_Db = (float)uVar4;
      in_XMM2_Dc = (float)((ulong)uVar4 >> 0x20);
      in_XMM2_Dd = 0.0;
      uVar4 = *(undefined8 *)(lVar10 + 0x1c + lVar16);
      in_XMM6_Da = *(float *)(lVar10 + 0x18 + lVar16);
      in_XMM6_Db = (float)uVar4;
      in_XMM6_Dc = (float)((ulong)uVar4 >> 0x20);
      in_XMM6_Dd = 0.0;
      uVar4 = *(undefined8 *)(lVar10 + 0x28 + lVar16);
      in_XMM4_Da = *(float *)(lVar10 + 0x24 + lVar16);
      in_XMM4_Db = (float)uVar4;
      in_XMM4_Dc = (float)((ulong)uVar4 >> 0x20);
      in_XMM4_Dd = 0.0;
    }
    else if (iVar6 == 0xb001) {
      lVar10 = *plVar9;
      lVar16 = uVar14 * plVar9[2];
      pfVar2 = (float *)(lVar10 + 0x10 + lVar16);
      in_XMM6_Da = *pfVar2;
      in_XMM6_Db = pfVar2[1];
      uVar4 = *(undefined8 *)(lVar10 + 0x34 + lVar16);
      in_XMM13_Da = *(float *)(lVar10 + lVar16);
      in_XMM2_Db = *(float *)(lVar10 + 4 + lVar16);
      in_XMM6_Dc = *(float *)(lVar10 + 8 + lVar16);
      in_XMM2_Da = *(float *)(lVar10 + 0xc + lVar16);
      in_XMM13_Db = (float)uVar4;
      in_XMM13_Dc = (float)((ulong)uVar4 >> 0x20);
      in_XMM4_Da = *(float *)(lVar10 + 0x18 + lVar16);
      uVar4 = *(undefined8 *)(lVar10 + 0x1c + lVar16);
      in_XMM4_Db = (float)uVar4;
      in_XMM4_Dc = (float)((ulong)uVar4 >> 0x20);
      fVar40 = *(float *)(lVar10 + 0x24 + lVar16);
      fVar46 = *(float *)(lVar10 + 0x28 + lVar16);
      fVar30 = *(float *)(lVar10 + 0x2c + lVar16);
      fVar23 = *(float *)(lVar10 + 0x30 + lVar16);
      fVar41 = fVar23 * fVar23 + fVar30 * fVar30 + fVar40 * fVar40 + fVar46 * fVar46;
      auVar20 = rsqrtss(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41));
      fVar24 = auVar20._0_4_;
      fVar24 = fVar24 * fVar24 * fVar41 * -0.5 * fVar24 + fVar24 * 1.5;
      in_XMM4_Dd = fVar40 * fVar24;
      in_XMM13_Dd = fVar46 * fVar24;
      in_XMM2_Dd = fVar30 * fVar24;
      in_XMM6_Dd = fVar24 * fVar23;
      in_XMM2_Dc = *(float *)(lVar10 + 0x3c + lVar16);
    }
    else if (iVar6 == 0x9244) {
      lVar10 = *plVar9;
      lVar16 = uVar14 * plVar9[2];
      pfVar2 = (float *)(lVar10 + lVar16);
      in_XMM13_Da = *pfVar2;
      in_XMM13_Db = pfVar2[1];
      in_XMM13_Dc = pfVar2[2];
      in_XMM13_Dd = pfVar2[3];
      pfVar2 = (float *)(lVar10 + 0x10 + lVar16);
      in_XMM2_Da = *pfVar2;
      in_XMM2_Db = pfVar2[1];
      in_XMM2_Dc = pfVar2[2];
      in_XMM2_Dd = pfVar2[3];
      pfVar2 = (float *)(lVar10 + 0x20 + lVar16);
      in_XMM6_Da = *pfVar2;
      in_XMM6_Db = pfVar2[1];
      in_XMM6_Dc = pfVar2[2];
      in_XMM6_Dd = pfVar2[3];
      pfVar2 = (float *)(lVar10 + 0x30 + lVar16);
      in_XMM4_Da = *pfVar2;
      in_XMM4_Db = pfVar2[1];
      in_XMM4_Dc = pfVar2[2];
      in_XMM4_Dd = pfVar2[3];
    }
    fVar24 = in_XMM13_Dd * in_XMM2_Dd + in_XMM6_Dd * in_XMM4_Dd;
    fVar30 = in_XMM13_Dd * in_XMM2_Dd - in_XMM6_Dd * in_XMM4_Dd;
    fVar46 = in_XMM4_Dd * in_XMM4_Dd - in_XMM13_Dd * in_XMM13_Dd;
    fVar23 = in_XMM4_Dd * in_XMM4_Dd + in_XMM13_Dd * in_XMM13_Dd + -in_XMM2_Dd * in_XMM2_Dd +
             -in_XMM6_Dd * in_XMM6_Dd;
    fVar41 = in_XMM2_Dd * in_XMM2_Dd + fVar46 + -in_XMM6_Dd * in_XMM6_Dd;
    fVar50 = in_XMM13_Dd * in_XMM6_Dd - in_XMM2_Dd * in_XMM4_Dd;
    fVar37 = in_XMM2_Dd * in_XMM4_Dd + in_XMM13_Dd * in_XMM6_Dd;
    fVar44 = in_XMM2_Dd * in_XMM6_Dd + in_XMM13_Dd * in_XMM4_Dd;
    fVar40 = in_XMM2_Dd * in_XMM6_Dd - in_XMM13_Dd * in_XMM4_Dd;
    fVar24 = fVar24 + fVar24;
    fVar50 = fVar50 + fVar50;
    fVar46 = in_XMM6_Dd * in_XMM6_Dd + fVar46 + -in_XMM2_Dd * in_XMM2_Dd;
    fVar33 = fVar23 * 1.0 + fVar24 * 0.0 + fVar50 * 0.0;
    fVar36 = fVar23 * 0.0 + fVar24 * 1.0 + fVar50 * 0.0;
    fVar50 = fVar23 * 0.0 + fVar24 * 0.0 + fVar50 * 1.0;
    fVar44 = fVar44 + fVar44;
    fVar30 = fVar30 + fVar30;
    fVar23 = fVar30 * 1.0 + fVar41 * 0.0 + fVar44 * 0.0;
    fVar24 = fVar30 * 0.0 + fVar41 * 1.0 + fVar44 * 0.0;
    fVar41 = fVar30 * 0.0 + fVar41 * 0.0 + fVar44 * 1.0;
    fVar37 = fVar37 + fVar37;
    fVar40 = fVar40 + fVar40;
    fVar30 = fVar37 * 1.0 + fVar40 * 0.0 + fVar46 * 0.0;
    fVar44 = fVar37 * 0.0 + fVar40 * 1.0 + fVar46 * 0.0;
    fVar46 = fVar37 * 0.0 + fVar40 * 0.0 + fVar46 * 1.0;
    in_XMM14_Da = in_XMM13_Da * fVar33 + fVar23 * 0.0 + fVar30 * 0.0;
    in_XMM14_Db = in_XMM13_Da * fVar36 + fVar24 * 0.0 + fVar44 * 0.0;
    in_XMM14_Dc = in_XMM13_Da * fVar50 + fVar41 * 0.0 + fVar46 * 0.0;
    in_XMM1_Da = in_XMM2_Da * fVar33 + in_XMM2_Db * fVar23 + fVar30 * 0.0;
    in_XMM1_Db = in_XMM2_Da * fVar36 + in_XMM2_Db * fVar24 + fVar44 * 0.0;
    in_XMM1_Dc = in_XMM2_Da * fVar50 + in_XMM2_Db * fVar41 + fVar46 * 0.0;
    auVar18._0_4_ = in_XMM6_Da * fVar33 + in_XMM6_Db * fVar23 + in_XMM6_Dc * fVar30;
    auVar18._4_4_ = in_XMM6_Da * fVar36 + in_XMM6_Db * fVar24 + in_XMM6_Dc * fVar44;
    auVar18._8_4_ = in_XMM6_Da * fVar50 + in_XMM6_Db * fVar41 + in_XMM6_Dc * fVar46;
    fVar40 = in_XMM4_Da * fVar33 + in_XMM4_Db * fVar23 + in_XMM4_Dc * fVar30;
    fVar30 = in_XMM4_Da * fVar36 + in_XMM4_Db * fVar24 + in_XMM4_Dc * fVar44;
    fVar46 = in_XMM4_Da * fVar50 + in_XMM4_Db * fVar41 + in_XMM4_Dc * fVar46;
    fVar23 = in_XMM13_Db;
    fVar24 = in_XMM13_Dc;
  }
  else {
    local_178._0_4_ = pGVar7->fnumTimeSegments;
    fVar40 = (pGVar7->time_range).lower;
    auVar25._4_8_ = 0;
    auVar25._0_4_ = fVar40;
    fVar46 = (((ray->dir).field_0.m128[3] - fVar40) / ((pGVar7->time_range).upper - fVar40)) *
             (float)local_178._0_4_;
    fVar40 = floorf(fVar46);
    if ((float)local_178._0_4_ + -1.0 <= fVar40) {
      fVar40 = (float)local_178._0_4_ + -1.0;
    }
    fVar30 = 0.0;
    fVar24 = 0.0;
    fVar23 = 0.0;
    if (0.0 <= fVar40) {
      fVar23 = fVar40;
    }
    uVar13 = (uint)fVar23;
    fVar46 = fVar46 - fVar23;
    lVar10 = *(long *)&pGVar7[1].fnumTimeSegments;
    plVar9 = (long *)(lVar10 + (ulong)uVar13 * 0x38);
    iVar6 = *(int *)(lVar10 + 0x20 + (ulong)uVar13 * 0x38);
    if ((pGVar7->field_8).field_0x1 != '\x01') {
      if (iVar6 == 0x9134) {
        lVar16 = *plVar9;
        lVar15 = plVar9[2] * uVar14;
        in_XMM14_Db = *(float *)(lVar16 + 0x10 + lVar15);
        in_XMM14_Da = *(float *)(lVar16 + lVar15);
        fVar23 = *(float *)(lVar16 + 4 + lVar15);
        fVar40 = *(float *)(lVar16 + 8 + lVar15);
        in_XMM13_Da = *(float *)(lVar16 + 0xc + lVar15);
        in_XMM14_Dc = *(float *)(lVar16 + 0x20 + lVar15);
        fVar30 = *(float *)(lVar16 + 0x14 + lVar15);
        fVar24 = *(float *)(lVar16 + 0x24 + lVar15);
        fVar33 = *(float *)(lVar16 + 0x18 + lVar15);
        fVar41 = *(float *)(lVar16 + 0x28 + lVar15);
        in_XMM13_Db = *(float *)(lVar16 + 0x1c + lVar15);
        in_XMM13_Dc = *(float *)(lVar16 + 0x2c + lVar15);
        auVar25._4_8_ = 0;
        auVar25._0_4_ = in_XMM13_Dc;
      }
      else if (iVar6 == 0x9234) {
        lVar16 = *plVar9;
        lVar15 = plVar9[2] * uVar14;
        uVar4 = *(undefined8 *)(lVar16 + 4 + lVar15);
        in_XMM14_Da = *(float *)(lVar16 + lVar15);
        in_XMM14_Db = (float)uVar4;
        in_XMM14_Dc = (float)((ulong)uVar4 >> 0x20);
        uVar4 = *(undefined8 *)(lVar16 + 0x10 + lVar15);
        fVar23 = *(float *)(lVar16 + 0xc + lVar15);
        fVar30 = (float)uVar4;
        fVar24 = (float)((ulong)uVar4 >> 0x20);
        uVar4 = *(undefined8 *)(lVar16 + 0x1c + lVar15);
        fVar40 = *(float *)(lVar16 + 0x18 + lVar15);
        fVar33 = (float)uVar4;
        fVar41 = (float)((ulong)uVar4 >> 0x20);
        uVar3 = *(ulong *)(lVar16 + 0x28 + lVar15);
        auVar25._8_4_ = 0;
        auVar25._0_8_ = uVar3;
        in_XMM13_Da = *(float *)(lVar16 + 0x24 + lVar15);
        in_XMM13_Db = (float)uVar3;
        in_XMM13_Dc = (float)(uVar3 >> 0x20);
      }
      else if (iVar6 == 0xb001) {
        lVar16 = *plVar9;
        lVar15 = plVar9[2] * uVar14;
        pfVar2 = (float *)(lVar16 + 0x10 + lVar15);
        fVar40 = *pfVar2;
        fVar33 = pfVar2[1];
        uVar4 = *(undefined8 *)(lVar16 + 0x34 + lVar15);
        in_XMM14_Da = *(float *)(lVar16 + lVar15);
        fVar30 = *(float *)(lVar16 + 4 + lVar15);
        fVar41 = *(float *)(lVar16 + 8 + lVar15);
        in_XMM6_Db = 0.0;
        in_XMM6_Dc = 0.0;
        fVar23 = *(float *)(lVar16 + 0xc + lVar15);
        in_XMM13_Da = *(float *)(lVar16 + 0x18 + lVar15);
        uVar5 = *(undefined8 *)(lVar16 + 0x1c + lVar15);
        in_XMM4_Da = (float)uVar5;
        in_XMM4_Db = (float)((ulong)uVar5 >> 0x20);
        in_XMM4_Dc = 0.0;
        fVar24 = *(float *)(lVar16 + 0x24 + lVar15);
        fVar36 = *(float *)(lVar16 + 0x28 + lVar15);
        fVar50 = *(float *)(lVar16 + 0x2c + lVar15);
        fVar37 = *(float *)(lVar16 + 0x30 + lVar15);
        fVar36 = fVar37 * fVar37 + fVar50 * fVar50 + fVar24 * fVar24 + fVar36 * fVar36;
        auVar20 = rsqrtss(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36));
        fVar24 = auVar20._0_4_;
        auVar31._0_4_ = fVar50 * (fVar24 * fVar24 * fVar36 * -0.5 * fVar24 + fVar24 * 1.5);
        auVar31._4_8_ = 0;
        in_XMM14_Db = (float)uVar4;
        in_XMM14_Dc = (float)((ulong)uVar4 >> 0x20);
        fVar24 = *(float *)(lVar16 + 0x3c + lVar15);
        auVar25._4_4_ = auVar31._0_4_;
        auVar25._0_4_ = fVar24;
        auVar25._8_4_ = 0;
        in_XMM13_Db = in_XMM4_Da;
        in_XMM13_Dc = in_XMM4_Db;
        in_XMM6_Da = fVar41;
      }
      else {
        fVar33 = extraout_XMM0_Db;
        fVar41 = extraout_XMM0_Dc;
        if (iVar6 == 0x9244) {
          lVar16 = *plVar9;
          lVar15 = plVar9[2] * uVar14;
          pfVar2 = (float *)(lVar16 + lVar15);
          in_XMM14_Da = *pfVar2;
          in_XMM14_Db = pfVar2[1];
          in_XMM14_Dc = pfVar2[2];
          pfVar2 = (float *)(lVar16 + 0x10 + lVar15);
          fVar23 = *pfVar2;
          fVar30 = pfVar2[1];
          fVar24 = pfVar2[2];
          pfVar2 = (float *)(lVar16 + 0x20 + lVar15);
          fVar40 = *pfVar2;
          fVar33 = pfVar2[1];
          fVar41 = pfVar2[2];
          pfVar2 = (float *)(lVar16 + 0x30 + lVar15);
          in_XMM13_Da = *pfVar2;
          in_XMM13_Db = pfVar2[1];
          in_XMM13_Dc = pfVar2[2];
        }
      }
      lVar16 = (ulong)(uVar13 + 1) * 0x38;
      plVar9 = (long *)(lVar10 + lVar16);
      iVar6 = *(int *)(lVar10 + 0x20 + lVar16);
      if (iVar6 == 0x9134) {
        lVar10 = *plVar9;
        lVar16 = uVar14 * plVar9[2];
        auVar25._4_4_ = *(undefined4 *)(lVar10 + 0x10 + lVar16);
        auVar25._0_4_ = *(undefined4 *)(lVar10 + lVar16);
        in_XMM6_Da = *(float *)(lVar10 + 4 + lVar16);
        in_XMM4_Da = *(float *)(lVar10 + 8 + lVar16);
        auVar25._8_4_ = *(undefined4 *)(lVar10 + 0x20 + lVar16);
        in_XMM6_Db = *(float *)(lVar10 + 0x14 + lVar16);
        in_XMM6_Dc = *(float *)(lVar10 + 0x24 + lVar16);
        in_XMM4_Db = *(float *)(lVar10 + 0x18 + lVar16);
        in_XMM4_Dc = *(float *)(lVar10 + 0x28 + lVar16);
        auVar31._4_4_ = *(undefined4 *)(lVar10 + 0x1c + lVar16);
        auVar31._0_4_ = (float)*(undefined4 *)(lVar10 + 0xc + lVar16);
        auVar31._8_4_ = *(undefined4 *)(lVar10 + 0x2c + lVar16);
      }
      else if (iVar6 == 0x9234) {
        lVar10 = *plVar9;
        lVar16 = uVar14 * plVar9[2];
        uVar4 = *(undefined8 *)(lVar10 + 4 + lVar16);
        auVar25._4_4_ = (int)uVar4;
        auVar25._0_4_ = *(undefined4 *)(lVar10 + lVar16);
        auVar25._8_4_ = (int)((ulong)uVar4 >> 0x20);
        uVar4 = *(undefined8 *)(lVar10 + 0x10 + lVar16);
        in_XMM6_Da = *(float *)(lVar10 + 0xc + lVar16);
        in_XMM6_Db = (float)uVar4;
        in_XMM6_Dc = (float)((ulong)uVar4 >> 0x20);
        uVar4 = *(undefined8 *)(lVar10 + 0x1c + lVar16);
        in_XMM4_Da = *(float *)(lVar10 + 0x18 + lVar16);
        in_XMM4_Db = (float)uVar4;
        in_XMM4_Dc = (float)((ulong)uVar4 >> 0x20);
        uVar4 = *(undefined8 *)(lVar10 + 0x28 + lVar16);
        auVar31._4_4_ = (int)uVar4;
        auVar31._0_4_ = (float)*(undefined4 *)(lVar10 + 0x24 + lVar16);
        auVar31._8_4_ = (int)((ulong)uVar4 >> 0x20);
      }
      else if (iVar6 == 0xb001) {
        lVar10 = *plVar9;
        lVar16 = uVar14 * plVar9[2];
        uVar4 = *(undefined8 *)(lVar10 + 0x10 + lVar16);
        in_XMM4_Da = (float)uVar4;
        in_XMM4_Db = (float)((ulong)uVar4 >> 0x20);
        uVar4 = *(undefined8 *)(lVar10 + 0x34 + lVar16);
        in_XMM6_Db = *(float *)(lVar10 + 4 + lVar16);
        in_XMM4_Dc = *(float *)(lVar10 + 8 + lVar16);
        in_XMM6_Da = *(float *)(lVar10 + 0xc + lVar16);
        uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar16);
        fVar36 = *(float *)(lVar10 + 0x24 + lVar16);
        fVar50 = *(float *)(lVar10 + 0x28 + lVar16);
        fVar37 = *(float *)(lVar10 + 0x2c + lVar16);
        fVar44 = *(float *)(lVar10 + 0x30 + lVar16);
        fVar36 = fVar44 * fVar44 + fVar37 * fVar37 + fVar36 * fVar36 + fVar50 * fVar50;
        rsqrtss(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36));
        uStack_144 = (undefined4)((ulong)uVar4 >> 0x20);
        auVar25._4_4_ = (int)uVar4;
        auVar25._0_4_ = *(undefined4 *)(lVar10 + lVar16);
        auVar25._8_4_ = uStack_144;
        in_XMM6_Dc = *(float *)(lVar10 + 0x3c + lVar16);
        auVar31._4_4_ = (int)uVar5;
        auVar31._0_4_ = (float)*(undefined4 *)(lVar10 + 0x18 + lVar16);
        auVar31._8_4_ = (int)((ulong)uVar5 >> 0x20);
      }
      else if (iVar6 == 0x9244) {
        lVar10 = *plVar9;
        lVar16 = uVar14 * plVar9[2];
        auVar25 = SUB1612(*(undefined1 (*) [16])(lVar10 + lVar16),0);
        pfVar2 = (float *)(lVar10 + 0x10 + lVar16);
        in_XMM6_Da = *pfVar2;
        in_XMM6_Db = pfVar2[1];
        in_XMM6_Dc = pfVar2[2];
        pfVar2 = (float *)(lVar10 + 0x20 + lVar16);
        in_XMM4_Da = *pfVar2;
        in_XMM4_Db = pfVar2[1];
        in_XMM4_Dc = pfVar2[2];
        auVar31 = SUB1612(*(undefined1 (*) [16])(lVar10 + 0x30 + lVar16),0);
      }
      fVar36 = 1.0 - fVar46;
      in_XMM14_Da = in_XMM14_Da * fVar36 + auVar25._0_4_ * fVar46;
      in_XMM14_Db = in_XMM14_Db * fVar36 + auVar25._4_4_ * fVar46;
      in_XMM14_Dc = in_XMM14_Dc * fVar36 + auVar25._8_4_ * fVar46;
      in_XMM1_Da = fVar23 * fVar36 + in_XMM6_Da * fVar46;
      in_XMM1_Db = fVar30 * fVar36 + in_XMM6_Db * fVar46;
      in_XMM1_Dc = fVar24 * fVar36 + in_XMM6_Dc * fVar46;
      auVar18._0_4_ = fVar40 * fVar36 + in_XMM4_Da * fVar46;
      auVar18._4_4_ = fVar33 * fVar36 + in_XMM4_Db * fVar46;
      auVar18._8_4_ = fVar41 * fVar36 + in_XMM4_Dc * fVar46;
      in_XMM5_Da = fVar36 * in_XMM13_Da + fVar46 * auVar31._0_4_;
      in_XMM5_Db = fVar36 * in_XMM13_Db + fVar46 * auVar31._4_4_;
      in_XMM5_Dc = fVar36 * in_XMM13_Dc + fVar46 * auVar31._8_4_;
      goto LAB_00181b7d;
    }
    if (iVar6 == 0x9134) {
      lVar16 = *plVar9;
      lVar15 = plVar9[2] * uVar14;
      local_178._4_4_ = *(undefined4 *)(lVar16 + 0x10 + lVar15);
      local_178._0_4_ = *(undefined4 *)(lVar16 + lVar15);
      uStack_170._0_4_ = (float)*(undefined4 *)(lVar16 + 0x20 + lVar15);
      uStack_170._4_4_ = 0.0;
      local_158._4_4_ = *(undefined4 *)(lVar16 + 0x14 + lVar15);
      local_158._0_4_ = *(undefined4 *)(lVar16 + 4 + lVar15);
      fStack_150 = (float)*(undefined4 *)(lVar16 + 0x24 + lVar15);
      fStack_14c = 0.0;
      local_118._4_4_ = *(undefined4 *)(lVar16 + 0x18 + lVar15);
      local_118._0_4_ = *(undefined4 *)(lVar16 + 8 + lVar15);
      fStack_110 = (float)*(undefined4 *)(lVar16 + 0x28 + lVar15);
      fStack_10c = 0.0;
      local_128._4_4_ = *(undefined4 *)(lVar16 + 0x1c + lVar15);
      local_128._0_4_ = *(undefined4 *)(lVar16 + 0xc + lVar15);
      fStack_120 = (float)*(undefined4 *)(lVar16 + 0x2c + lVar15);
      fStack_11c = 0.0;
    }
    else if (iVar6 == 0x9234) {
      lVar16 = *plVar9;
      lVar15 = plVar9[2] * uVar14;
      uVar4 = *(undefined8 *)(lVar16 + 4 + lVar15);
      local_178._4_4_ = (int)uVar4;
      local_178._0_4_ = *(undefined4 *)(lVar16 + lVar15);
      uStack_170._0_4_ = (float)(int)((ulong)uVar4 >> 0x20);
      uStack_170._4_4_ = 0.0;
      uVar4 = *(undefined8 *)(lVar16 + 0x10 + lVar15);
      local_158._4_4_ = (int)uVar4;
      local_158._0_4_ = *(undefined4 *)(lVar16 + 0xc + lVar15);
      fStack_150 = (float)(int)((ulong)uVar4 >> 0x20);
      fStack_14c = 0.0;
      uVar4 = *(undefined8 *)(lVar16 + 0x1c + lVar15);
      local_118._4_4_ = (int)uVar4;
      local_118._0_4_ = *(undefined4 *)(lVar16 + 0x18 + lVar15);
      fStack_110 = (float)(int)((ulong)uVar4 >> 0x20);
      fStack_10c = 0.0;
      uVar4 = *(undefined8 *)(lVar16 + 0x28 + lVar15);
      local_128._4_4_ = (int)uVar4;
      local_128._0_4_ = *(undefined4 *)(lVar16 + 0x24 + lVar15);
      fStack_120 = (float)(int)((ulong)uVar4 >> 0x20);
      fStack_11c = 0.0;
    }
    else if (iVar6 == 0xb001) {
      lVar16 = *plVar9;
      lVar15 = plVar9[2] * uVar14;
      pfVar2 = (float *)(lVar16 + 0x10 + lVar15);
      in_XMM12_Da = *pfVar2;
      in_XMM12_Db = pfVar2[1];
      uVar4 = *(undefined8 *)(lVar16 + 0x34 + lVar15);
      in_XMM10_Da = *(float *)(lVar16 + lVar15);
      in_XMM11_Db = *(float *)(lVar16 + 4 + lVar15);
      in_XMM12_Dc = *(float *)(lVar16 + 8 + lVar15);
      in_XMM11_Da = *(float *)(lVar16 + 0xc + lVar15);
      in_XMM13_Da = *(float *)(lVar16 + 0x18 + lVar15);
      uVar5 = *(undefined8 *)(lVar16 + 0x1c + lVar15);
      in_XMM13_Db = (float)uVar5;
      in_XMM13_Dc = (float)((ulong)uVar5 >> 0x20);
      fVar40 = *(float *)(lVar16 + 0x24 + lVar15);
      in_XMM10_Dd = *(float *)(lVar16 + 0x28 + lVar15);
      in_XMM11_Dd = *(float *)(lVar16 + 0x2c + lVar15);
      fVar30 = *(float *)(lVar16 + 0x30 + lVar15);
      fVar24 = fVar30 * fVar30 +
               in_XMM11_Dd * in_XMM11_Dd + fVar40 * fVar40 + in_XMM10_Dd * in_XMM10_Dd;
      auVar20 = rsqrtss(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24));
      fVar23 = auVar20._0_4_;
      in_XMM12_Dd = fVar23 * fVar23 * fVar24 * -0.5 * fVar23 + fVar23 * 1.5;
      in_XMM13_Dd = fVar40 * in_XMM12_Dd;
      in_XMM10_Dd = in_XMM10_Dd * in_XMM12_Dd;
      in_XMM11_Dd = in_XMM11_Dd * in_XMM12_Dd;
      in_XMM12_Dd = in_XMM12_Dd * fVar30;
      fStack_110 = in_XMM12_Dc;
      local_118 = (undefined1  [8])*(undefined8 *)pfVar2;
      fStack_10c = in_XMM12_Dd;
      in_XMM10_Db = (float)uVar4;
      in_XMM10_Dc = (float)((ulong)uVar4 >> 0x20);
      local_178._4_4_ = in_XMM10_Db;
      local_178._0_4_ = in_XMM10_Da;
      uStack_170._0_4_ = in_XMM10_Dc;
      uStack_170._4_4_ = in_XMM10_Dd;
      in_XMM11_Dc = *(float *)(lVar16 + 0x3c + lVar15);
      local_158._4_4_ = in_XMM11_Db;
      local_158._0_4_ = in_XMM11_Da;
      fStack_150 = in_XMM11_Dc;
      fStack_14c = in_XMM11_Dd;
      local_128._4_4_ = in_XMM13_Db;
      local_128._0_4_ = in_XMM13_Da;
      fStack_120 = in_XMM13_Dc;
      fStack_11c = in_XMM13_Dd;
    }
    else if (iVar6 == 0x9244) {
      lVar16 = *plVar9;
      lVar15 = plVar9[2] * uVar14;
      _local_178 = *(undefined1 (*) [16])(lVar16 + lVar15);
      _local_158 = *(undefined1 (*) [16])(lVar16 + 0x10 + lVar15);
      _local_118 = *(undefined1 (*) [16])(lVar16 + 0x20 + lVar15);
      _local_128 = *(undefined1 (*) [16])(lVar16 + 0x30 + lVar15);
    }
    lVar16 = (ulong)(uVar13 + 1) * 0x38;
    plVar9 = (long *)(lVar10 + lVar16);
    iVar6 = *(int *)(lVar10 + 0x20 + lVar16);
    if (iVar6 == 0x9134) {
      lVar10 = *plVar9;
      lVar16 = uVar14 * plVar9[2];
      in_XMM10_Db = *(float *)(lVar10 + 0x10 + lVar16);
      in_XMM10_Da = *(float *)(lVar10 + lVar16);
      in_XMM12_Da = *(float *)(lVar10 + 4 + lVar16);
      in_XMM11_Da = *(float *)(lVar10 + 8 + lVar16);
      in_XMM13_Da = *(float *)(lVar10 + 0xc + lVar16);
      in_XMM10_Dc = *(float *)(lVar10 + 0x20 + lVar16);
      in_XMM10_Dd = 0.0;
      in_XMM12_Db = *(float *)(lVar10 + 0x14 + lVar16);
      in_XMM12_Dc = *(float *)(lVar10 + 0x24 + lVar16);
      in_XMM12_Dd = 0.0;
      in_XMM11_Db = *(float *)(lVar10 + 0x18 + lVar16);
      in_XMM11_Dc = *(float *)(lVar10 + 0x28 + lVar16);
      in_XMM11_Dd = 0.0;
      in_XMM13_Db = *(float *)(lVar10 + 0x1c + lVar16);
      in_XMM13_Dc = *(float *)(lVar10 + 0x2c + lVar16);
      in_XMM13_Dd = 0.0;
    }
    else if (iVar6 == 0x9234) {
      lVar10 = *plVar9;
      lVar16 = uVar14 * plVar9[2];
      uVar4 = *(undefined8 *)(lVar10 + 4 + lVar16);
      in_XMM10_Da = *(float *)(lVar10 + lVar16);
      in_XMM10_Db = (float)uVar4;
      in_XMM10_Dc = (float)((ulong)uVar4 >> 0x20);
      in_XMM10_Dd = 0.0;
      uVar4 = *(undefined8 *)(lVar10 + 0x10 + lVar16);
      in_XMM12_Da = *(float *)(lVar10 + 0xc + lVar16);
      in_XMM12_Db = (float)uVar4;
      in_XMM12_Dc = (float)((ulong)uVar4 >> 0x20);
      in_XMM12_Dd = 0.0;
      uVar4 = *(undefined8 *)(lVar10 + 0x1c + lVar16);
      in_XMM11_Da = *(float *)(lVar10 + 0x18 + lVar16);
      in_XMM11_Db = (float)uVar4;
      in_XMM11_Dc = (float)((ulong)uVar4 >> 0x20);
      in_XMM11_Dd = 0.0;
      uVar4 = *(undefined8 *)(lVar10 + 0x28 + lVar16);
      in_XMM13_Da = *(float *)(lVar10 + 0x24 + lVar16);
      in_XMM13_Db = (float)uVar4;
      in_XMM13_Dc = (float)((ulong)uVar4 >> 0x20);
      in_XMM13_Dd = 0.0;
    }
    else if (iVar6 == 0xb001) {
      lVar10 = *plVar9;
      lVar16 = uVar14 * plVar9[2];
      uVar4 = *(undefined8 *)(lVar10 + 0x10 + lVar16);
      in_XMM11_Da = (float)uVar4;
      in_XMM11_Db = (float)((ulong)uVar4 >> 0x20);
      uVar4 = *(undefined8 *)(lVar10 + 0x34 + lVar16);
      in_XMM10_Da = *(float *)(lVar10 + lVar16);
      in_XMM12_Db = *(float *)(lVar10 + 4 + lVar16);
      in_XMM11_Dc = *(float *)(lVar10 + 8 + lVar16);
      in_XMM12_Da = *(float *)(lVar10 + 0xc + lVar16);
      in_XMM13_Da = *(float *)(lVar10 + 0x18 + lVar16);
      uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar16);
      in_XMM13_Db = (float)uVar5;
      in_XMM13_Dc = (float)((ulong)uVar5 >> 0x20);
      fVar40 = *(float *)(lVar10 + 0x24 + lVar16);
      in_XMM10_Dd = *(float *)(lVar10 + 0x28 + lVar16);
      in_XMM12_Dd = *(float *)(lVar10 + 0x2c + lVar16);
      fVar30 = *(float *)(lVar10 + 0x30 + lVar16);
      fVar24 = fVar30 * fVar30 +
               in_XMM12_Dd * in_XMM12_Dd + fVar40 * fVar40 + in_XMM10_Dd * in_XMM10_Dd;
      auVar20 = rsqrtss(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24));
      fVar23 = auVar20._0_4_;
      in_XMM11_Dd = fVar23 * fVar23 * fVar24 * -0.5 * fVar23 + fVar23 * 1.5;
      in_XMM13_Dd = fVar40 * in_XMM11_Dd;
      in_XMM10_Dd = in_XMM10_Dd * in_XMM11_Dd;
      in_XMM12_Dd = in_XMM12_Dd * in_XMM11_Dd;
      in_XMM11_Dd = in_XMM11_Dd * fVar30;
      in_XMM10_Db = (float)uVar4;
      in_XMM10_Dc = (float)((ulong)uVar4 >> 0x20);
      in_XMM12_Dc = *(float *)(lVar10 + 0x3c + lVar16);
    }
    else if (iVar6 == 0x9244) {
      lVar10 = *plVar9;
      lVar16 = uVar14 * plVar9[2];
      pfVar2 = (float *)(lVar10 + lVar16);
      in_XMM10_Da = *pfVar2;
      in_XMM10_Db = pfVar2[1];
      in_XMM10_Dc = pfVar2[2];
      in_XMM10_Dd = pfVar2[3];
      pfVar2 = (float *)(lVar10 + 0x10 + lVar16);
      in_XMM12_Da = *pfVar2;
      in_XMM12_Db = pfVar2[1];
      in_XMM12_Dc = pfVar2[2];
      in_XMM12_Dd = pfVar2[3];
      pfVar2 = (float *)(lVar10 + 0x20 + lVar16);
      in_XMM11_Da = *pfVar2;
      in_XMM11_Db = pfVar2[1];
      in_XMM11_Dc = pfVar2[2];
      in_XMM11_Dd = pfVar2[3];
      pfVar2 = (float *)(lVar10 + 0x30 + lVar16);
      in_XMM13_Da = *pfVar2;
      in_XMM13_Db = pfVar2[1];
      in_XMM13_Dc = pfVar2[2];
      in_XMM13_Dd = pfVar2[3];
    }
    fVar30 = fStack_10c * in_XMM11_Dd +
             fStack_14c * in_XMM12_Dd + in_XMM13_Dd * fStack_11c + uStack_170._4_4_ * in_XMM10_Dd;
    fVar40 = -fVar30;
    if (fVar30 < fVar40) {
      in_XMM12_Dd = -in_XMM12_Dd;
    }
    fVar24 = ABS(fVar30);
    fVar23 = fVar40;
    if (fVar40 <= fVar30) {
      fVar23 = fVar30;
    }
    fVar41 = 1.0 - fVar24;
    if (fVar41 < 0.0) {
      fVar41 = sqrtf(fVar41);
    }
    else {
      fVar41 = SQRT(fVar41);
    }
    fVar33 = 1.5707964 -
             fVar41 * (((((fVar24 * -0.0043095737 + 0.0192803) * fVar24 + -0.04489909) * fVar24 +
                        0.08785567) * fVar24 + -0.21450998) * fVar24 + 1.5707952);
    fVar41 = 0.0;
    if (0.0 <= fVar33) {
      fVar41 = fVar33;
    }
    fVar36 = (float)(-(uint)(1.0 < fVar24) & 0x7fc00000 |
                    ~-(uint)(1.0 < fVar24) &
                    (uint)(1.5707964 -
                          (float)((uint)-fVar41 & -(uint)(fVar23 < 0.0) |
                                 ~-(uint)(fVar23 < 0.0) & (uint)fVar41))) * fVar46;
    fVar33 = floorf(fVar36 * 0.63661975);
    fVar36 = fVar36 - fVar33 * 1.5707964;
    fVar41 = fVar36 * fVar36;
    uVar13 = (int)fVar33 & 3;
    fVar24 = ((((fVar41 * -2.5963018e-07 + 2.4756235e-05) * fVar41 + -0.001388833) * fVar41 +
              0.04166664) * fVar41 + -0.5) * fVar41 + 1.0;
    fVar36 = (((((fVar41 * -2.5029328e-08 + 2.7600126e-06) * fVar41 + -0.00019842605) * fVar41 +
               0.008333348) * fVar41 + -0.16666667) * fVar41 + 1.0) * fVar36;
    fVar41 = fVar36;
    if (((int)fVar33 & 1U) != 0) {
      fVar41 = fVar24;
      fVar24 = fVar36;
    }
    local_148 = (float)(~-(uint)(fVar30 < fVar40) & (uint)in_XMM11_Dd |
                       (uint)-in_XMM11_Dd & -(uint)(fVar30 < fVar40));
    if (1 < uVar13) {
      fVar41 = -fVar41;
    }
    if (uVar13 - 1 < 2) {
      fVar24 = -fVar24;
    }
    fVar47 = fVar23 * fStack_14c - in_XMM12_Dd;
    fVar36 = fVar23 * fStack_10c - local_148;
    fVar40 = 1.0 - fVar46;
    fVar51 = fVar40 * fStack_14c + in_XMM12_Dd * fVar46;
    fVar33 = fVar40 * fStack_10c + local_148 * fVar46;
    uVar13 = (int)((uint)(fVar30 < 0.0) << 0x1f) >> 0x1f;
    uVar32 = (int)((uint)(fVar30 < 0.0) << 0x1f) >> 0x1f;
    fVar44 = (float)((uint)-in_XMM13_Dd & uVar13 | ~uVar13 & (uint)in_XMM13_Dd);
    fVar38 = (float)((uint)-in_XMM10_Dd & uVar32 | ~uVar32 & (uint)in_XMM10_Dd);
    fVar30 = fVar23 * fStack_11c - fVar44;
    fVar50 = fVar23 * uStack_170._4_4_ - fVar38;
    auVar22._0_8_ = CONCAT44(fStack_10c,fVar36) ^ 0x8000000000000000;
    auVar22._8_4_ = -fStack_10c;
    auVar22._12_4_ = -fStack_10c;
    auVar27._4_12_ = auVar22._4_12_;
    auVar27._0_4_ = fVar36 * fVar36 + fVar47 * fVar47 + fVar30 * fVar30 + fVar50 * fVar50;
    auVar20._0_8_ = CONCAT44(fStack_10c,auVar27._0_4_) ^ 0x8000000000000000;
    auVar20._8_4_ = -fStack_10c;
    auVar20._12_4_ = -fStack_10c;
    auVar20 = rsqrtss(auVar20,auVar27);
    fVar37 = auVar20._0_4_;
    fVar34 = fVar37 * fVar37 * auVar27._0_4_ * -0.5 * fVar37 + fVar37 * 1.5;
    fVar37 = fStack_11c * fVar40 + fVar44 * fVar46;
    fVar44 = uStack_170._4_4_ * fVar40 + fVar38 * fVar46;
    fVar43 = fVar33 * fVar33 + fVar51 * fVar51 + fVar37 * fVar37 + fVar44 * fVar44;
    auVar20 = rsqrtss(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43));
    fVar38 = auVar20._0_4_;
    fVar38 = fVar38 * fVar38 * fVar43 * -0.5 * fVar38 + fVar38 * 1.5;
    uVar13 = (int)((uint)(0.9995 < fVar23) << 0x1f) >> 0x1f;
    uVar32 = (int)((uint)(0.9995 < fVar23) << 0x1f) >> 0x1f;
    fVar30 = (float)(~uVar13 & (uint)(fVar24 * fStack_11c - fVar41 * fVar34 * fVar30) |
                    (uint)(fVar38 * fVar37) & uVar13);
    fVar50 = (float)(~uVar32 & (uint)(fVar24 * uStack_170._4_4_ - fVar41 * fVar34 * fVar50) |
                    (uint)(fVar38 * fVar44) & uVar32);
    if (0.9995 < fVar23) {
      fVar51 = fVar51 * fVar38;
      fVar33 = fVar33 * fVar38;
    }
    else {
      fVar51 = fStack_14c * fVar24 - fVar47 * fVar34 * fVar41;
      fVar33 = fStack_10c * fVar24 - fVar36 * fVar34 * fVar41;
    }
    fVar48 = (float)local_178._0_4_ * fVar40 + in_XMM10_Da * fVar46;
    fVar23 = (float)local_178._4_4_ * fVar40 + in_XMM10_Db * fVar46;
    fVar24 = (float)uStack_170 * fVar40 + in_XMM10_Dc * fVar46;
    fVar41 = (float)local_158._0_4_ * fVar40 + in_XMM12_Da * fVar46;
    fVar36 = (float)local_158._4_4_ * fVar40 + in_XMM12_Db * fVar46;
    in_XMM2_Dc = fStack_150 * fVar40 + in_XMM12_Dc * fVar46;
    fVar34 = (float)local_118._0_4_ * fVar40 + in_XMM11_Da * fVar46;
    fVar38 = (float)local_118._4_4_ * fVar40 + in_XMM11_Db * fVar46;
    fVar43 = fStack_110 * fVar40 + in_XMM11_Dc * fVar46;
    fVar37 = (float)local_128._0_4_ * fVar40 + in_XMM13_Da * fVar46;
    fVar44 = (float)local_128._4_4_ * fVar40 + in_XMM13_Db * fVar46;
    fVar46 = fStack_120 * fVar40 + in_XMM13_Dc * fVar46;
    fVar28 = fVar50 * fVar51 + fVar30 * fVar33;
    fVar29 = fVar50 * fVar51 - fVar30 * fVar33;
    fVar47 = fVar30 * fVar30 + fVar50 * fVar50 + -fVar51 * fVar51 + -fVar33 * fVar33;
    fVar40 = fVar30 * fVar30 - fVar50 * fVar50;
    fVar39 = fVar51 * fVar51 + fVar40 + -fVar33 * fVar33;
    fVar45 = fVar50 * fVar33 - fVar30 * fVar51;
    fVar35 = fVar30 * fVar51 + fVar50 * fVar33;
    fVar42 = fVar51 * fVar33 + fVar30 * fVar50;
    fVar52 = fVar51 * fVar33 - fVar30 * fVar50;
    fVar28 = fVar28 + fVar28;
    fVar45 = fVar45 + fVar45;
    fVar40 = fVar33 * fVar33 + fVar40 + -fVar51 * fVar51;
    fVar30 = fVar47 * 1.0 + fVar28 * 0.0 + fVar45 * 0.0;
    fVar33 = fVar47 * 0.0 + fVar28 * 1.0 + fVar45 * 0.0;
    fVar50 = fVar47 * 0.0 + fVar28 * 0.0 + fVar45 * 1.0;
    fVar42 = fVar42 + fVar42;
    fVar29 = fVar29 + fVar29;
    fVar47 = fVar29 * 1.0 + fVar39 * 0.0 + fVar42 * 0.0;
    fVar51 = fVar29 * 0.0 + fVar39 * 1.0 + fVar42 * 0.0;
    fVar28 = fVar29 * 0.0 + fVar39 * 0.0 + fVar42 * 1.0;
    fVar35 = fVar35 + fVar35;
    fVar52 = fVar52 + fVar52;
    fVar29 = fVar35 * 1.0 + fVar52 * 0.0 + fVar40 * 0.0;
    fVar39 = fVar35 * 0.0 + fVar52 * 1.0 + fVar40 * 0.0;
    fVar35 = fVar35 * 0.0 + fVar52 * 0.0 + fVar40 * 1.0;
    in_XMM14_Da = fVar48 * fVar30 + fVar47 * 0.0 + fVar29 * 0.0;
    in_XMM14_Db = fVar48 * fVar33 + fVar51 * 0.0 + fVar39 * 0.0;
    in_XMM14_Dc = fVar48 * fVar50 + fVar28 * 0.0 + fVar35 * 0.0;
    in_XMM1_Da = fVar41 * fVar30 + fVar36 * fVar47 + fVar29 * 0.0;
    in_XMM1_Db = fVar41 * fVar33 + fVar36 * fVar51 + fVar39 * 0.0;
    in_XMM1_Dc = fVar41 * fVar50 + fVar36 * fVar28 + fVar35 * 0.0;
    auVar18._0_4_ = fVar34 * fVar30 + fVar38 * fVar47 + fVar43 * fVar29;
    auVar18._4_4_ = fVar34 * fVar33 + fVar38 * fVar51 + fVar43 * fVar39;
    auVar18._8_4_ = fVar34 * fVar50 + fVar38 * fVar28 + fVar43 * fVar35;
    fVar40 = fVar37 * fVar30 + fVar44 * fVar47 + fVar46 * fVar29;
    fVar30 = fVar37 * fVar33 + fVar44 * fVar51 + fVar46 * fVar39;
    fVar46 = fVar37 * fVar50 + fVar44 * fVar28 + fVar46 * fVar35;
  }
  in_XMM5_Da = fVar40 + fVar23 + 0.0;
  in_XMM5_Db = fVar30 + fVar24 + 0.0;
  in_XMM5_Dc = fVar46 + in_XMM2_Dc + 0.0;
LAB_00181b7d:
  fVar40 = auVar18._0_4_;
  fVar46 = auVar18._4_4_;
  fVar30 = auVar18._8_4_;
  auVar21._0_4_ = in_XMM1_Da * fVar46 - in_XMM1_Db * fVar40;
  fVar23 = in_XMM1_Db * fVar30 - in_XMM1_Dc * fVar46;
  fVar24 = in_XMM1_Dc * fVar40 - in_XMM1_Da * fVar30;
  auVar19._4_4_ = fVar46 * in_XMM14_Dc - fVar30 * in_XMM14_Db;
  auVar21._4_4_ = fVar40 * in_XMM14_Db - fVar46 * in_XMM14_Da;
  auVar21._8_4_ = in_XMM14_Da * in_XMM1_Db - in_XMM14_Db * in_XMM1_Da;
  auVar21._12_4_ = 0;
  auVar19._0_4_ = fVar23;
  auVar19._8_4_ = in_XMM14_Db * in_XMM1_Dc - in_XMM14_Dc * in_XMM1_Db;
  auVar19._12_4_ = 0;
  auVar26._4_4_ = fVar30 * in_XMM14_Da - fVar40 * in_XMM14_Dc;
  auVar26._0_4_ = fVar24;
  auVar26._8_4_ = in_XMM14_Dc * in_XMM1_Da - in_XMM14_Da * in_XMM1_Dc;
  auVar26._12_4_ = 0;
  auVar49._0_4_ = in_XMM14_Dc * auVar21._0_4_ + in_XMM14_Db * fVar24 + in_XMM14_Da * fVar23;
  auVar49._4_4_ = auVar49._0_4_;
  auVar49._8_4_ = auVar49._0_4_;
  auVar49._12_4_ = auVar49._0_4_;
  auVar20 = divps(auVar19,auVar49);
  auVar27 = divps(auVar26,auVar49);
  auVar22 = divps(auVar21,auVar49);
  fVar44 = auVar22._0_4_;
  fVar34 = auVar22._4_4_;
  fVar38 = auVar22._8_4_;
  fVar43 = auVar27._0_4_;
  fVar47 = auVar27._4_4_;
  fVar51 = auVar27._8_4_;
  fVar36 = auVar20._0_4_;
  fVar50 = auVar20._4_4_;
  fVar37 = auVar20._8_4_;
  fVar46 = (ray->org).field_0.m128[0];
  fVar30 = (ray->org).field_0.m128[1];
  fVar23 = (ray->org).field_0.m128[2];
  auVar18 = *(undefined1 (*) [12])&(ray->org).field_0;
  aVar11 = (ray->org).field_0;
  pVVar1 = &ray->dir;
  fVar24 = (pVVar1->field_0).m128[0];
  fVar41 = (ray->dir).field_0.m128[1];
  fVar33 = (ray->dir).field_0.m128[2];
  auVar31 = *(undefined1 (*) [12])&pVVar1->field_0;
  aVar12 = pVVar1->field_0;
  fVar40 = (ray->org).field_0.m128[3];
  (ray->org).field_0.m128[0] =
       fVar46 * fVar36 +
       fVar30 * fVar43 +
       (fVar23 * fVar44 - (in_XMM5_Da * fVar36 + in_XMM5_Db * fVar43 + in_XMM5_Dc * fVar44));
  (ray->org).field_0.m128[1] =
       fVar46 * fVar50 +
       fVar30 * fVar47 +
       (fVar23 * fVar34 - (in_XMM5_Da * fVar50 + in_XMM5_Db * fVar47 + in_XMM5_Dc * fVar34));
  (ray->org).field_0.m128[2] =
       fVar46 * fVar37 +
       fVar30 * fVar51 +
       (fVar23 * fVar38 - (in_XMM5_Da * fVar37 + in_XMM5_Db * fVar51 + in_XMM5_Dc * fVar38));
  (ray->org).field_0.m128[3] = fVar40;
  fVar40 = (ray->dir).field_0.m128[3];
  (ray->dir).field_0.m128[0] = fVar24 * fVar36 + fVar41 * fVar43 + fVar33 * fVar44;
  (ray->dir).field_0.m128[1] = fVar24 * fVar50 + fVar41 * fVar47 + fVar33 * fVar34;
  (ray->dir).field_0.m128[2] = fVar24 * fVar37 + fVar41 * fVar51 + fVar33 * fVar38;
  (ray->dir).field_0.m128[3] = fVar40;
  (**(code **)(p_Var17 + 0x80))(p_Var17 + 0x58,ray);
  local_168 = auVar18._0_8_;
  uStack_160 = aVar11._8_8_;
  *(undefined8 *)&(ray->org).field_0 = local_168;
  *(undefined8 *)((long)&(ray->org).field_0 + 8) = uStack_160;
  local_178 = auVar31._0_8_;
  uStack_170 = aVar12._8_8_;
  *(undefined1 (*) [8])&(ray->dir).field_0 = local_178;
  *(undefined8 *)((long)&(ray->dir).field_0 + 8) = uStack_170;
  fVar46 = ray->tfar;
  fVar40 = ray->tfar;
  pRVar8->instID[0] = 0xffffffff;
  pRVar8->instPrimID[0] = 0xffffffff;
  return fVar40 <= 0.0 && fVar46 != 0.0;
}

Assistant:

bool InstanceArrayIntersector1MB::occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return false;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      bool occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_, ray.time());
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded((RTCRay&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);      
      }
      return occluded;
    }